

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebm_util.cc
# Opt level: O0

bool libwebm::ParseVP9SuperFrameIndex
               (uint8_t *frame,size_t frame_length,Ranges *frame_ranges,bool *error)

{
  bool *this;
  size_type sVar1;
  Range local_90;
  int local_7c;
  uint local_78;
  int j;
  uint32_t child_frame_length;
  int i;
  size_t frame_offset;
  uint8_t *byte;
  size_t length;
  size_t index_length;
  int local_48;
  int length_field_size;
  int num_frames;
  uint32_t kFrameCountMask;
  uint32_t kLengthFieldSizeMask;
  uint32_t kSuperFrameMarker;
  uint32_t kHasSuperFrameIndexMask;
  uint8_t marker;
  bool parse_ok;
  bool *error_local;
  Ranges *frame_ranges_local;
  size_t frame_length_local;
  uint8_t *frame_local;
  
  if ((((frame == (uint8_t *)0x0) || (frame_length == 0)) || (frame_ranges == (Ranges *)0x0)) ||
     (error == (bool *)0x0)) {
    frame_local._7_1_ = false;
  }
  else {
    kSuperFrameMarker._3_1_ = 0;
    kSuperFrameMarker._2_1_ = frame[frame_length - 1];
    kLengthFieldSizeMask = 0xe0;
    kFrameCountMask = 0xc0;
    num_frames = 3;
    if ((kSuperFrameMarker._2_1_ & 0xe0) == 0xc0) {
      length_field_size = 7;
      local_48 = (kSuperFrameMarker._2_1_ & 7) + 1;
      index_length._4_4_ = ((int)(uint)kSuperFrameMarker._2_1_ >> 3 & 3U) + 1;
      length = (size_t)(index_length._4_4_ * local_48 + 2);
      _kHasSuperFrameIndexMask = error;
      error_local = (bool *)frame_ranges;
      frame_ranges_local = (Ranges *)frame_length;
      frame_length_local = (size_t)frame;
      if (frame_length < length) {
        fprintf(_stderr,"VP9ParseSuperFrameIndex: Invalid superframe index size.\n");
        *_kHasSuperFrameIndexMask = true;
        return false;
      }
      byte = (uint8_t *)(frame_length - length);
      if ((byte < length) || (frame[frame_length - length] != kSuperFrameMarker._2_1_)) {
        fprintf(_stderr,"VP9Parse: Invalid superframe index.\n");
        *_kHasSuperFrameIndexMask = true;
      }
      else {
        frame_offset = (size_t)(frame + (long)byte + 1);
        _child_frame_length = 0;
        for (j = 0; this = error_local, j < local_48; j = j + 1) {
          local_78 = 0;
          for (local_7c = 0; local_7c < index_length._4_4_; local_7c = local_7c + 1) {
            local_78 = (uint)*(byte *)frame_offset << ((byte)(local_7c << 3) & 0x1f) | local_78;
            frame_offset = frame_offset + 1;
          }
          if ((long)byte - _child_frame_length < (ulong)local_78) {
            fprintf(_stderr,
                    "ParseVP9SuperFrameIndex: Invalid superframe, sub frame larger than entire frame.\n"
                   );
            *_kHasSuperFrameIndexMask = true;
            return false;
          }
          Range::Range(&local_90,_child_frame_length,(ulong)local_78);
          std::vector<libwebm::Range,_std::allocator<libwebm::Range>_>::push_back
                    ((vector<libwebm::Range,_std::allocator<libwebm::Range>_> *)this,&local_90);
          _child_frame_length = local_78 + _child_frame_length;
        }
        sVar1 = std::vector<libwebm::Range,_std::allocator<libwebm::Range>_>::size
                          ((vector<libwebm::Range,_std::allocator<libwebm::Range>_> *)error_local);
        if ((int)sVar1 != local_48) {
          fprintf(_stderr,"VP9Parse: superframe index parse failed.\n");
          *_kHasSuperFrameIndexMask = true;
          return false;
        }
        kSuperFrameMarker._3_1_ = 1;
      }
    }
    frame_local._7_1_ = (bool)(kSuperFrameMarker._3_1_ & 1);
  }
  return frame_local._7_1_;
}

Assistant:

bool ParseVP9SuperFrameIndex(const std::uint8_t* frame,
                             std::size_t frame_length, Ranges* frame_ranges,
                             bool* error) {
  if (frame == nullptr || frame_length == 0 || frame_ranges == nullptr ||
      error == nullptr) {
    return false;
  }

  bool parse_ok = false;
  const std::uint8_t marker = frame[frame_length - 1];
  const std::uint32_t kHasSuperFrameIndexMask = 0xe0;
  const std::uint32_t kSuperFrameMarker = 0xc0;
  const std::uint32_t kLengthFieldSizeMask = 0x3;

  if ((marker & kHasSuperFrameIndexMask) == kSuperFrameMarker) {
    const std::uint32_t kFrameCountMask = 0x7;
    const int num_frames = (marker & kFrameCountMask) + 1;
    const int length_field_size = ((marker >> 3) & kLengthFieldSizeMask) + 1;
    const std::size_t index_length = 2 + length_field_size * num_frames;

    if (frame_length < index_length) {
      std::fprintf(stderr,
                   "VP9ParseSuperFrameIndex: Invalid superframe index size.\n");
      *error = true;
      return false;
    }

    // Consume the super frame index. Note: it's at the end of the super frame.
    const std::size_t length = frame_length - index_length;

    if (length >= index_length &&
        frame[frame_length - index_length] == marker) {
      // Found a valid superframe index.
      const std::uint8_t* byte = frame + length + 1;

      std::size_t frame_offset = 0;

      for (int i = 0; i < num_frames; ++i) {
        std::uint32_t child_frame_length = 0;

        for (int j = 0; j < length_field_size; ++j) {
          child_frame_length |= (*byte++) << (j * 8);
        }

        if (length - frame_offset < child_frame_length) {
          std::fprintf(stderr,
                       "ParseVP9SuperFrameIndex: Invalid superframe, sub frame "
                       "larger than entire frame.\n");
          *error = true;
          return false;
        }

        frame_ranges->push_back(Range(frame_offset, child_frame_length));
        frame_offset += child_frame_length;
      }

      if (static_cast<int>(frame_ranges->size()) != num_frames) {
        std::fprintf(stderr, "VP9Parse: superframe index parse failed.\n");
        *error = true;
        return false;
      }

      parse_ok = true;
    } else {
      std::fprintf(stderr, "VP9Parse: Invalid superframe index.\n");
      *error = true;
    }
  }
  return parse_ok;
}